

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O1

int __thiscall
ddd::DictionarySGL<false,_true>::stat(DictionarySGL<false,_true> *this,char *__file,stat *__buf)

{
  uint uVar1;
  DaTrie<false,_true,_false> *pDVar2;
  long lVar3;
  pointer pBVar4;
  long lVar5;
  pointer pcVar6;
  pointer pBVar7;
  pointer pcVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  pDVar2 = (this->trie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl;
  uVar1 = pDVar2->bc_emps_;
  pBVar7 = *(pointer *)
            ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 0x10);
  lVar3 = *(long *)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>;
  pBVar4 = *(pointer *)
            ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8);
  auVar10._8_4_ = (int)lVar3;
  auVar10._0_8_ = lVar3;
  auVar10._12_4_ = (int)((ulong)lVar3 >> 0x20);
  uVar9 = (ulong)((long)*(pointer *)
                         ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                         + 8) - lVar3) >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar9 - uVar1);
  *(ulong *)(__file + 0x18) = uVar9 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)((long)pBVar7 - auVar10._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar1;
  lVar5 = *(long *)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl;
  pcVar8 = *(pointer *)
            ((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 0x10);
  auVar11._8_4_ = (int)lVar5;
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
  pcVar6 = *(pointer *)((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 8);
  *(ulong *)(__file + 0x30) =
       (long)*(pointer *)
              ((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 8) - lVar5 &
       0xffffffff;
  *(ulong *)(__file + 0x38) = (long)pcVar8 - auVar11._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)pDVar2->tail_emps_;
  *(pointer *)(__file + 0x48) =
       pcVar6 + (long)&pBVar4->field_0x0 +
       (long)*(pointer *)
              ((long)&(pDVar2->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>
              + 8) +
       (long)*(pointer *)
              ((long)&(pDVar2->node_links_).
                      super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> + 8) +
       (0x34 - (lVar3 + lVar5 +
                *(long *)&(pDVar2->blocks_).
                          super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl +
               *(long *)&(pDVar2->node_links_).
                         super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl))
  ;
  return (int)pDVar2;
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = trie_->num_nodes();
    ret.bc_size = trie_->bc_size();
    ret.bc_capa = trie_->bc_capa();
    ret.bc_emps = trie_->bc_emps();
    ret.tail_size = trie_->tail_size();
    ret.tail_capa = trie_->tail_capa();
    ret.tail_emps = trie_->tail_emps();
    ret.size_in_bytes = trie_->size_in_bytes() + sizeof(num_keys_);
  }